

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GaussianPuffRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::GaussianPuffRecord::GaussianPuffRecord
          (GaussianPuffRecord *this,KUINT8 Index,WorldCoordinates *PuffLocation,
          WorldCoordinates *OriginationLocation,Vector *Sigma,Vector *DDT,EulerAngles *Orientation,
          Vector *Velocity,Vector *AngularVelocity,KFLOAT32 CentroidHeight)

{
  KFLOAT64 KVar1;
  KFLOAT32 KVar2;
  
  EnvironmentRecord::EnvironmentRecord(&this->super_EnvironmentRecord);
  (this->super_EnvironmentRecord).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GaussianPuffRecord_00221890;
  (this->m_PuffLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00220d48;
  KVar1 = PuffLocation->m_f64Y;
  (this->m_PuffLocation).m_f64X = PuffLocation->m_f64X;
  (this->m_PuffLocation).m_f64Y = KVar1;
  (this->m_PuffLocation).m_f64Z = PuffLocation->m_f64Z;
  (this->m_OrigLocation).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00220d48;
  KVar1 = OriginationLocation->m_f64Y;
  (this->m_OrigLocation).m_f64X = OriginationLocation->m_f64X;
  (this->m_OrigLocation).m_f64Y = KVar1;
  (this->m_OrigLocation).m_f64Z = OriginationLocation->m_f64Z;
  (this->m_Sigma).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_002216b8;
  KVar2 = Sigma->m_f32Y;
  (this->m_Sigma).m_f32X = Sigma->m_f32X;
  (this->m_Sigma).m_f32Y = KVar2;
  (this->m_Sigma).m_f32Z = Sigma->m_f32Z;
  (this->m_DDTSigma).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002216b8;
  KVar2 = DDT->m_f32Y;
  (this->m_DDTSigma).m_f32X = DDT->m_f32X;
  (this->m_DDTSigma).m_f32Y = KVar2;
  (this->m_DDTSigma).m_f32Z = DDT->m_f32Z;
  (this->m_Ori).super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00221fc8;
  KVar2 = Orientation->m_f32Theta;
  (this->m_Ori).m_f32Psi = Orientation->m_f32Psi;
  (this->m_Ori).m_f32Theta = KVar2;
  (this->m_Ori).m_f32Phi = Orientation->m_f32Phi;
  (this->m_Velocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002216b8;
  (this->m_Velocity).m_f32Z = Velocity->m_f32Z;
  KVar2 = Velocity->m_f32Y;
  (this->m_Velocity).m_f32X = Velocity->m_f32X;
  (this->m_Velocity).m_f32Y = KVar2;
  (this->m_AngularVelocity).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_002216b8;
  (this->m_AngularVelocity).m_f32Z = AngularVelocity->m_f32Z;
  KVar2 = AngularVelocity->m_f32Y;
  (this->m_AngularVelocity).m_f32X = AngularVelocity->m_f32X;
  (this->m_AngularVelocity).m_f32Y = KVar2;
  this->m_f32CentHeight = CentroidHeight;
  (this->super_EnvironmentRecord).m_ui8Index = Index;
  (this->super_EnvironmentRecord).m_ui32EnvRecTyp = 0x70000000;
  (this->super_EnvironmentRecord).m_ui16Length = 0x380;
  return;
}

Assistant:

GaussianPuffRecord::GaussianPuffRecord( KUINT8 Index, const WorldCoordinates & PuffLocation, const WorldCoordinates & OriginationLocation,
                                        const Vector & Sigma, const Vector & DDT, const EulerAngles & Orientation, const Vector & Velocity,
                                        const Vector & AngularVelocity, KFLOAT32 CentroidHeight ) :
    m_PuffLocation( PuffLocation ),
    m_OrigLocation( OriginationLocation ),
    m_Sigma( Sigma ),
    m_DDTSigma( DDT ),
    m_Ori( Orientation ),
    m_Velocity( Velocity ),
    m_AngularVelocity( AngularVelocity ),
    m_f32CentHeight( CentroidHeight )
{
    m_ui8Index = Index;
    m_ui32EnvRecTyp = GaussianPuffRecordType;
    m_ui16Length = ( GAUSSIAN_PUFF_RECORD_SIZE - ENVIRONMENT_RECORD_SIZE ) * 8;
}